

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O1

void __thiscall
TPZSparseBlockDiagonal<double>::MultAdd
          (TPZSparseBlockDiagonal<double> *this,TPZFMatrix<double> *x,TPZFMatrix<double> *y,
          TPZFMatrix<double> *z,double alpha,double beta,int opt)

{
  TPZFMatrix<double> local_5fb8;
  double adStack_5f28 [1001];
  TPZFMatrix<double> local_3fe0;
  double local_3f50 [1001];
  TPZFMatrix<double> local_2008;
  double local_1f78 [1001];
  
  local_2008.fElem = local_1f78;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01884590;
  local_2008.fSize = 1000;
  local_2008.fGiven = local_2008.fElem;
  TPZVec<int>::TPZVec(&local_2008.fPivot.super_TPZVec<int>,0);
  local_2008.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_2008.fPivot.super_TPZVec<int>.fStore = local_2008.fPivot.fExtAlloc;
  local_2008.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2008.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2008.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_2008.fWork.fStore = (double *)0x0;
  local_2008.fWork.fNElements = 0;
  local_2008.fWork.fNAlloc = 0;
  local_2008.fElem = (double *)0x0;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018842a0;
  local_5fb8.fElem = adStack_5f28;
  local_5fb8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5fb8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5fb8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_5fb8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_5fb8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01884590;
  local_5fb8.fSize = 1000;
  local_5fb8.fGiven = local_5fb8.fElem;
  TPZVec<int>::TPZVec(&local_5fb8.fPivot.super_TPZVec<int>,0);
  local_5fb8.fPivot.super_TPZVec<int>.fStore = local_5fb8.fPivot.fExtAlloc;
  local_5fb8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_5fb8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5fb8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5fb8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_5fb8.fWork.fStore = (double *)0x0;
  local_5fb8.fWork.fNElements = 0;
  local_5fb8.fWork.fNAlloc = 0;
  local_5fb8.fElem = (double *)0x0;
  local_5fb8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018842a0;
  TPZFMatrix<double>::operator=(&local_5fb8,0.0);
  local_3fe0.fElem = local_3f50;
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01884590;
  local_3fe0.fSize = 1000;
  local_3fe0.fGiven = local_3fe0.fElem;
  TPZVec<int>::TPZVec(&local_3fe0.fPivot.super_TPZVec<int>,0);
  local_3fe0.fPivot.super_TPZVec<int>.fStore = local_3fe0.fPivot.fExtAlloc;
  local_3fe0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3fe0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3fe0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3fe0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3fe0.fWork.fStore = (double *)0x0;
  local_3fe0.fWork.fNElements = 0;
  local_3fe0.fWork.fNAlloc = 0;
  local_3fe0.fElem = (double *)0x0;
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018842a0;
  TPZFMatrix<double>::Resize
            (&local_2008,(this->fBlock).fNElements,
             (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  (*(z->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(z);
  if ((beta != 0.0) || (NAN(beta))) {
    TPZFMatrix<double>::Resize
              (&local_5fb8,(this->fBlock).fNElements,
               (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  }
  TPZFMatrix<double>::Resize
            (&local_3fe0,(this->fBlock).fNElements,
             (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  Gather(this,x,&local_2008);
  if ((beta != 0.0) || (NAN(beta))) {
    Scatter(this,y,&local_5fb8);
  }
  TPZBlockDiagonal<double>::MultAdd
            (&this->super_TPZBlockDiagonal<double>,&local_2008,&local_5fb8,&local_3fe0,alpha,beta,
             opt);
  Scatter(this,&local_3fe0,z);
  TPZFMatrix<double>::~TPZFMatrix(&local_3fe0,&PTR_PTR_01884558);
  TPZFMatrix<double>::~TPZFMatrix(&local_5fb8,&PTR_PTR_01884558);
  TPZFMatrix<double>::~TPZFMatrix(&local_2008,&PTR_PTR_01884558);
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::MultAdd(const TPZFMatrix<TVar>& x, const TPZFMatrix<TVar>& y, TPZFMatrix<TVar>& z, const TVar alpha, const TVar beta, const int opt) const
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::MultAdd");
#endif
	TPZFNMatrix<1000,TVar> xsc(0,0),ysc(0,0,0.),zsc(0,0);
	xsc.Resize(this->fBlock.NElements(),x.Cols());
	z.Zero();
	if(abs(beta) != 0.) ysc.Resize(fBlock.NElements(),y.Cols());
	zsc.Resize(fBlock.NElements(),z.Cols());
	Gather(x,xsc);
	if(abs(beta) != 0.) Scatter(y,ysc);
	TPZBlockDiagonal<TVar>::MultAdd(xsc, ysc, zsc, alpha, beta, opt);
	Scatter(zsc,z);
}